

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::resizeEvent(QMdiArea *this,QResizeEvent *resizeEvent)

{
  QMdiAreaPrivate *this_00;
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  QSize QVar3;
  bool bVar4;
  bool bVar5;
  QSize QVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  QWidget *this_01;
  long in_FS_OFFSET;
  QSize local_58;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((this_00->childWindows).d.size == 0) {
    resizeEvent[0xc] = (QResizeEvent)0x0;
  }
  else {
    QMdiAreaPrivate::updateTabBarGeometry(this_00);
    if (this_00->isSubWindowsTiled == true) {
      this_00->tileCalledFromResizeEvent = true;
      tileSubWindows(this);
      this_00->tileCalledFromResizeEvent = false;
      this_00->isSubWindowsTiled = true;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QMdiAreaPrivate::startResizeTimer(this_00);
        return;
      }
      goto LAB_0040ec10;
    }
    local_50.d = (this_00->childWindows).d.d;
    pQVar1 = (this_00->childWindows).d.ptr;
    local_50.size = (this_00->childWindows).d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar9 = local_50.size * 0x10;
    bVar4 = false;
    local_50.ptr = pQVar1;
    for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 0x10) {
      lVar2 = *(long *)((long)&(pQVar1->wp).d + lVar8);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        this_01 = (QWidget *)0x0;
      }
      else {
        this_01 = *(QWidget **)((long)&(pQVar1->wp).value + lVar8);
      }
      bVar5 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::resizeEvent");
      if (bVar5) {
        bVar5 = QWidget::isMaximized(this_01);
        if (bVar5) {
          QVar6 = QWidget::size(this_01);
          if ((*(int *)(resizeEvent + 0x10) != QVar6.wd.m_i.m_i) ||
             (*(int *)(resizeEvent + 0x14) != QVar6.ht.m_i.m_i)) {
            local_58 = *(QSize *)(resizeEvent + 0x10);
            QVar6 = (QSize)(**(code **)(*(long *)this_01 + 0x78))(this_01);
            if (((ulong)QVar6 & 0x8000000080000000) == 0) {
              uVar7 = (ulong)QVar6 >> 0x20;
              QVar3 = local_58;
              if (local_58.wd.m_i <= QVar6.wd.m_i.m_i) {
                QVar3 = QVar6;
              }
              if (QVar6.ht.m_i.m_i < local_58.ht.m_i) {
                uVar7 = (ulong)(uint)local_58.ht.m_i;
              }
              local_58 = (QSize)((ulong)QVar3 & 0xffffffff | uVar7 << 0x20);
            }
            QWidget::resize(this_01,&local_58);
            if (!bVar4) {
              bVar4 = true;
            }
          }
        }
      }
    }
    QMdiAreaPrivate::updateScrollBars(this_00);
    if (bVar4) {
      QMdiAreaPrivate::startResizeTimer(this_00);
    }
    else {
      QMdiAreaPrivate::arrangeMinimizedSubWindows(this_00);
    }
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0040ec10:
  __stack_chk_fail();
}

Assistant:

void QMdiArea::resizeEvent(QResizeEvent *resizeEvent)
{
    Q_D(QMdiArea);
    if (d->childWindows.isEmpty()) {
        resizeEvent->ignore();
        return;
    }

#if QT_CONFIG(tabbar)
    d->updateTabBarGeometry();
#endif

    // Re-tile the views if we're in tiled mode. Re-tile means we will change
    // the geometry of the children, which in turn means 'isSubWindowsTiled'
    // is set to false, so we have to update the state at the end.
    if (d->isSubWindowsTiled) {
        d->tileCalledFromResizeEvent = true;
        tileSubWindows();
        d->tileCalledFromResizeEvent = false;
        d->isSubWindowsTiled = true;
        d->startResizeTimer();
        // We don't have scroll bars or any maximized views.
        return;
    }

    // Resize maximized views.
    bool hasMaximizedSubWindow = false;
    // Take a copy because child->resize() may call QCoreApplication::sendEvent()
    // which may invoke unknown code, that could e.g. recurse into the class
    // modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (sanityCheck(child, "QMdiArea::resizeEvent") && child->isMaximized()
                && child->size() != resizeEvent->size()) {
            auto realSize = resizeEvent->size();
            const auto minSizeHint = child->minimumSizeHint();
            // QMdiSubWindow is no tlw so minimumSize() is not set by the layout manager
            // and therefore we have to take care by ourself that we're not getting smaller
            // than allowed
            if (minSizeHint.isValid())
                realSize = realSize.expandedTo(minSizeHint);
            child->resize(realSize);
            if (!hasMaximizedSubWindow)
                hasMaximizedSubWindow = true;
        }
    }

    d->updateScrollBars();

    // Minimized views are stacked under maximized views so there's
    // no need to re-arrange minimized views on-demand. Start a timer
    // just to make things faster with subsequent resize events.
    if (hasMaximizedSubWindow)
        d->startResizeTimer();
    else
        d->arrangeMinimizedSubWindows();
}